

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O1

QDate __thiscall
QtPrivate::QCalendarMonthValidator::applyToDate
          (QCalendarMonthValidator *this,undefined8 param_2,undefined8 param_3)

{
  qint64 qVar1;
  int iVar2;
  long in_FS_OFFSET;
  undefined1 local_30 [16];
  
  local_30._8_8_ = *(long *)(in_FS_OFFSET + 0x28);
  local_30._0_8_ = param_3;
  QCalendar::partsFromDate((QDate)local_30);
  iVar2 = (int)(YearMonthDay *)local_30;
  QCalendar::monthsInYear(iVar2);
  QCalendar::daysInMonth(iVar2,this->m_month);
  qVar1 = QCalendar::dateFromParts((YearMonthDay *)local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30._8_8_) {
    __stack_chk_fail();
  }
  return (QDate)qVar1;
}

Assistant:

QDate QCalendarMonthValidator::applyToDate(QDate date, QCalendar cal) const
{
    auto parts = cal.partsFromDate(date);
    if (!parts.isValid())
        return QDate();
    parts.month = qMin(qMax(1, m_month), cal.monthsInYear(parts.year));
    parts.day = qMin(parts.day, cal.daysInMonth(m_month, parts.year)); // m_month or parts.month ?
    return cal.dateFromParts(parts);
}